

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

int Sfm_TimReadObjDelay(Sfm_Tim_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = Sfm_TimArrId(p,iObj);
  iVar1 = piVar2[1];
  if (piVar2[1] < *piVar2) {
    iVar1 = *piVar2;
  }
  return iVar1;
}

Assistant:

int Sfm_TimReadObjDelay( Sfm_Tim_t * p, int iObj )
{
    return Sfm_TimArrMaxId(p, iObj);
}